

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

bool QApplicationPrivate::shouldSetFocus(QWidget *w,FocusPolicy policy)

{
  QWidget *pQVar1;
  bool bVar2;
  FocusPolicy FVar3;
  long lVar4;
  long lVar5;
  QWidget *this;
  
  lVar4 = *(long *)(*(long *)&w->field_0x8 + 0x78);
  this = w;
  if ((lVar4 != 0) && (lVar5 = *(long *)(lVar4 + 0x30), lVar5 != 0)) {
    while (*(int *)(lVar5 + 4) != 0) {
      pQVar1 = *(QWidget **)(lVar4 + 0x38);
      if (((pQVar1 == (QWidget *)0x0) ||
          (lVar4 = *(long *)(*(long *)&pQVar1->field_0x8 + 0x78), this = pQVar1, lVar4 == 0)) ||
         (lVar5 = *(long *)(lVar4 + 0x30), lVar5 == 0)) break;
    }
  }
  FVar3 = QWidget::focusPolicy(w);
  if (((policy & ~FVar3) == NoFocus) &&
     ((this == w || (FVar3 = QWidget::focusPolicy(this), (policy & ~FVar3) == NoFocus)))) {
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool QApplicationPrivate::shouldSetFocus(QWidget *w, Qt::FocusPolicy policy)
{
    QWidget *f = w;
    while (f->d_func()->extra && f->d_func()->extra->focus_proxy)
        f = f->d_func()->extra->focus_proxy;

    if ((w->focusPolicy() & policy) != policy)
        return false;
    if (w != f && (f->focusPolicy() & policy) != policy)
        return false;
    return true;
}